

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O0

int __thiscall Assimp::CFIReaderImpl::getAttributeValueAsInt(CFIReaderImpl *this,char *name)

{
  bool bVar1;
  element_type *peVar2;
  size_type sVar3;
  const_reference pvVar4;
  element_type *peVar5;
  char *__nptr;
  int local_50;
  undefined1 local_38 [8];
  shared_ptr<const_Assimp::FIIntValue> intValue;
  Attribute *attr;
  char *name_local;
  CFIReaderImpl *this_local;
  
  intValue.super___shared_ptr<const_Assimp::FIIntValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)getAttributeByName(this,name);
  if ((Attribute *)
      intValue.super___shared_ptr<const_Assimp::FIIntValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi == (Attribute *)0x0) {
    this_local._4_4_ = 0;
  }
  else {
    std::dynamic_pointer_cast<Assimp::FIIntValue_const,Assimp::FIValue_const>
              ((shared_ptr<const_Assimp::FIValue> *)local_38);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_38);
    if (bVar1) {
      peVar2 = std::
               __shared_ptr_access<const_Assimp::FIIntValue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_Assimp::FIIntValue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_38);
      sVar3 = std::vector<int,_std::allocator<int>_>::size(&peVar2->value);
      if (sVar3 == 1) {
        peVar2 = std::
                 __shared_ptr_access<const_Assimp::FIIntValue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<const_Assimp::FIIntValue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_38);
        pvVar4 = std::vector<int,_std::allocator<int>_>::front(&peVar2->value);
        local_50 = *pvVar4;
      }
      else {
        local_50 = 0;
      }
      this_local._4_4_ = local_50;
    }
    else {
      peVar5 = std::
               __shared_ptr_access<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)(intValue.
                                super___shared_ptr<const_Assimp::FIIntValue,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi + 8));
      (**peVar5->_vptr_FIValue)();
      __nptr = (char *)std::__cxx11::string::c_str();
      this_local._4_4_ = atoi(__nptr);
    }
    std::shared_ptr<const_Assimp::FIIntValue>::~shared_ptr
              ((shared_ptr<const_Assimp::FIIntValue> *)local_38);
  }
  return this_local._4_4_;
}

Assistant:

virtual int getAttributeValueAsInt(const char* name) const /*override*/ {
        const Attribute* attr = getAttributeByName(name);
        if (!attr) {
            return 0;
        }
        std::shared_ptr<const FIIntValue> intValue = std::dynamic_pointer_cast<const FIIntValue>(attr->value);
        if (intValue) {
            return intValue->value.size() == 1 ? intValue->value.front() : 0;
        }
        return atoi(attr->value->toString().c_str());
    }